

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddSDESPrivateItem
          (RTCPCompoundPacketBuilder *this,void *prefixdata,uint8_t prefixlength,void *valuedata,
          uint8_t valuelength)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  RTPMemoryManager *mgr;
  uint8_t *buf_00;
  RTCPSDESHeader *sdeshdr;
  size_t len;
  uint8_t *buf;
  size_t sdessizewithextraitem;
  size_t totalotherbytes;
  size_t itemlength;
  uint8_t valuelength_local;
  void *valuedata_local;
  uint8_t prefixlength_local;
  void *prefixdata_local;
  RTCPCompoundPacketBuilder *this_local;
  
  if ((this->arebuilding & 1U) == 0) {
    this_local._4_4_ = -0x2a;
  }
  else {
    bVar3 = std::__cxx11::
            list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ::empty(&(this->sdes).sdessources);
    if (bVar3) {
      this_local._4_4_ = -0x28;
    }
    else {
      uVar4 = (ulong)prefixlength + 1 + (ulong)valuelength;
      if (uVar4 < 0x100) {
        sVar1 = this->byesize;
        sVar2 = this->appsize;
        sVar5 = Report::NeededBytes(&this->report);
        sVar6 = SDES::NeededBytesWithExtraItem(&this->sdes,(uint8_t)uVar4);
        if (this->maximumpacketsize < sVar6 + sVar1 + sVar2 + sVar5) {
          this_local._4_4_ = -0x2b;
        }
        else {
          mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          buf_00 = (uint8_t *)operator_new__(uVar4 + 2,mgr,7);
          if (buf_00 == (uint8_t *)0x0) {
            this_local._4_4_ = -1;
          }
          else {
            *buf_00 = '\b';
            buf_00[1] = (uint8_t)uVar4;
            buf_00[2] = prefixlength;
            if (prefixlength != '\0') {
              memcpy(buf_00 + 3,prefixdata,(ulong)prefixlength);
            }
            if (valuelength != '\0') {
              memcpy(buf_00 + (ulong)prefixlength + 3,valuedata,(ulong)valuelength);
            }
            SDES::AddItem(&this->sdes,buf_00,uVar4 + 2);
            this_local._4_4_ = 0;
          }
        }
      }
      else {
        this_local._4_4_ = -0x2e;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTCPCompoundPacketBuilder::AddSDESPrivateItem(const void *prefixdata,uint8_t prefixlength,const void *valuedata,
                                                  uint8_t valuelength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;
	if (sdes.sdessources.empty())
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;

	size_t itemlength = ((size_t)prefixlength)+1+((size_t)valuelength);
	if (itemlength > 255)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOTALITEMLENGTHTOOBIG;
	
#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = byesize+appsize+report.NeededBytes();
#else
	size_t totalotherbytes = byesize+appsize+unknownsize+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 
	size_t sdessizewithextraitem = sdes.NeededBytesWithExtraItem(itemlength);

	if ((sdessizewithextraitem+totalotherbytes) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t len;

	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPSDESBLOCK) uint8_t[sizeof(RTCPSDESHeader)+itemlength];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;
	len = sizeof(RTCPSDESHeader)+(size_t)itemlength;

	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(buf);

	sdeshdr->sdesid = RTCP_SDES_ID_PRIVATE;
	sdeshdr->length = itemlength;
	
	buf[sizeof(RTCPSDESHeader)] = prefixlength;
	if (prefixlength != 0)
		memcpy((buf+sizeof(RTCPSDESHeader)+1),prefixdata,(size_t)prefixlength);
	if (valuelength != 0)
		memcpy((buf+sizeof(RTCPSDESHeader)+1+(size_t)prefixlength),valuedata,(size_t)valuelength);

	sdes.AddItem(buf,len);
	return 0;
}